

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_next_cds(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  int iVar2;
  
  piVar1 = strm->state;
  if ((piVar1->offsets != (vector_t *)0x0) &&
     (piVar1->rsi_size == (long)piVar1->rsip - (long)piVar1->rsi_buffer >> 2)) {
    vector_push_back(piVar1->offsets,(strm->total_in - strm->avail_in) * 8 - (long)piVar1->bitp);
  }
  if (piVar1->rsi_size == (long)piVar1->rsip - (long)piVar1->rsi_buffer >> 2) {
    (*piVar1->flush_output)(strm);
    piVar1->flush_start = piVar1->rsi_buffer;
    piVar1->rsip = piVar1->rsi_buffer;
    if (piVar1->pp != 0) {
      piVar1->ref = 1;
      piVar1->encoded_block_size = strm->block_size - 1;
    }
    if ((strm->flags & 0x20) != 0) {
      piVar1->bitp = piVar1->bitp - piVar1->bitp % 8;
    }
  }
  else {
    piVar1->ref = 0;
    piVar1->encoded_block_size = strm->block_size;
  }
  iVar2 = m_id(strm);
  return iVar2;
}

Assistant:

static int m_next_cds(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if ((state->offsets != NULL) && (state->rsi_size == RSI_USED_SIZE(state)))
        vector_push_back(
            state->offsets,
            strm->total_in * 8 - (strm->avail_in * 8 + state->bitp));

    if (state->rsi_size == RSI_USED_SIZE(state)) {
        state->flush_output(strm);
        state->flush_start = state->rsi_buffer;
        state->rsip = state->rsi_buffer;
        if (state->pp) {
            state->ref = 1;
            state->encoded_block_size = strm->block_size - 1;
        }
        if (strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    return m_id(strm);
}